

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::loadNative(SchemaLoader *this,RawSchema *nativeSchema)

{
  kj::_::Mutex::lock((Mutex *)this,EXCLUSIVE);
  Impl::loadNative((this->impl).value.ptr,nativeSchema);
  kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE);
  return;
}

Assistant:

void SchemaLoader::loadNative(const _::RawSchema* nativeSchema) {
  impl.lockExclusive()->get()->loadNative(nativeSchema);
}